

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall
Fl_Tree_Item::insert(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label,int pos)

{
  Fl_Tree_Item *this_00;
  
  this_00 = (Fl_Tree_Item *)operator_new(0x88);
  Fl_Tree_Item(this_00,prefs);
  label(this_00,new_label);
  this_00->_parent = this;
  Fl_Tree_Item_Array::insert(&this->_children,pos,this_00);
  return this_00;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::insert(const Fl_Tree_Prefs &prefs, const char *new_label, int pos) {
#if FLTK_ABI_VERSION >= 10303
  Fl_Tree_Item *item = new Fl_Tree_Item(_tree);
#else
  Fl_Tree_Item *item = new Fl_Tree_Item(prefs);
#endif
  item->label(new_label);
  item->_parent = this;
  _children.insert(pos, item);
  recalc_tree();		// may change tree geometry
  return(item);
}